

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall
ON_MeshCache::Internal_DeleteItem(ON_MeshCache *this,ON_MeshCacheItem *item,bool bDeleteMesh)

{
  void *p;
  bool bDeleteMesh_local;
  ON_MeshCacheItem *item_local;
  ON_MeshCache *this_local;
  
  if (item != (ON_MeshCacheItem *)0x0) {
    if (bDeleteMesh) {
      ON_MeshCacheItem::~ON_MeshCacheItem(item);
    }
    onfree(item);
  }
  return;
}

Assistant:

void ON_MeshCache::Internal_DeleteItem(class ON_MeshCacheItem* item, bool bDeleteMesh)
{
  if (nullptr == item)
    return;
  void* p = (void*)item;

  // When bDeleteMesh is false, the memory used by item->m_mesh_sp and the ON_Mesh
  // it points to belongs to a memory pool that has been deleted because a worker
  // thread was canceled.  In this case, calling ~ON_MeshCacheItem() will crash the
  // application.
  if ( bDeleteMesh )
  {
    item->~ON_MeshCacheItem();
  }

  onfree(p);
}